

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_4,_2> * tcu::operator*(Matrix<double,_4,_1> *a,Matrix<double,_1,_2> *b)

{
  double dVar1;
  double *pdVar2;
  int row_1;
  long lVar3;
  Matrix<double,_4,_2> *res;
  double *in_RDI;
  double *pdVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  
  pdVar2 = in_RDI;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  pdVar4 = in_RDI;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3ff0000000000000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined8 *)((long)pdVar4 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 == 0x20);
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while (lVar5 != 4);
  lVar3 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar3];
    lVar5 = 0;
    do {
      *(double *)((long)in_RDI + lVar5 * 4) =
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar5) * dVar1 + 0.0;
      lVar5 = lVar5 + 8;
    } while (lVar5 == 8);
    lVar3 = lVar3 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar3 != 4);
  return (Matrix<double,_4,_2> *)pdVar2;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}